

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

string * IntToStr_abi_cxx11_(string *__return_storage_ptr__,int pos)

{
  allocator local_19;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToStr (const int pos){
	int row = GetRow (pos);
	int col = GetCol(pos);
	std::string s = "";
	s += (char) (col - 3 + 'a');
	s += (char) (row + P1[row] + '0');
	return s;
}